

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.h
# Opt level: O0

void __thiscall
Minisat::IntOption::getNonDefaultString(IntOption *this,int granularity,char *buffer,size_t size)

{
  char *__s;
  int iVar1;
  size_type sVar2;
  reference pvVar3;
  uint *puVar4;
  size_t sVar5;
  vector<int,_std::allocator<int>_> *in_RCX;
  char *in_RDX;
  int in_ESI;
  long in_RDI;
  int sl_1;
  int i_1;
  int sl;
  size_t i;
  vector<int,_std::allocator<int>_> values;
  vector<int,_std::allocator<int>_> *in_stack_ffffffffffffff70;
  vector<int,_std::allocator<int>_> *pvVar6;
  undefined4 in_stack_ffffffffffffffa0;
  undefined4 in_stack_ffffffffffffffa4;
  uint local_58;
  ulong local_50;
  vector<int,_std::allocator<int>_> local_38;
  vector<int,_std::allocator<int>_> *local_20;
  char *local_18;
  
  local_20 = in_RCX;
  local_18 = in_RDX;
  if (in_ESI == 0) {
    if ((*(int *)(in_RDI + 0x34) - *(int *)(in_RDI + 0x30) < 0x11) &&
       (1 < *(int *)(in_RDI + 0x34) - *(int *)(in_RDI + 0x30))) {
      for (local_58 = *(uint *)(in_RDI + 0x30); (int)local_58 <= *(int *)(in_RDI + 0x34);
          local_58 = local_58 + 1) {
        if (local_58 != *(uint *)(in_RDI + 0x3c)) {
          snprintf(local_18,(size_t)local_20,"%d",(ulong)local_58);
          sVar5 = strlen(local_18);
          pvVar6 = local_20;
          iVar1 = (int)sVar5;
          sVar5 = strlen(local_18);
          local_20 = (vector<int,_std::allocator<int>_> *)((long)pvVar6 + (-1 - sVar5));
          if ((local_58 != *(uint *)(in_RDI + 0x34)) && (local_58 + 1 != *(int *)(in_RDI + 0x3c))) {
            local_18[iVar1] = ',';
            local_18[iVar1 + 1] = '\0';
            local_18 = local_18 + (iVar1 + 1);
          }
        }
      }
    }
  }
  else {
    pvVar6 = &local_38;
    std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)0x10dcb0);
    fillGranularityDomain
              ((IntOption *)CONCAT44(in_stack_ffffffffffffffa4,in_stack_ffffffffffffffa0),
               (int)((ulong)in_RDI >> 0x20),pvVar6);
    for (local_50 = 0; sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_38),
        local_50 < sVar2; local_50 = local_50 + 1) {
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,local_50);
      __s = local_18;
      if (*pvVar3 != *(int *)(in_RDI + 0x3c)) {
        in_stack_ffffffffffffff70 = local_20;
        puVar4 = (uint *)std::vector<int,_std::allocator<int>_>::operator[](&local_38,local_50);
        snprintf(__s,(size_t)in_stack_ffffffffffffff70,"%d",(ulong)*puVar4);
        sVar5 = strlen(local_18);
        pvVar6 = local_20;
        iVar1 = (int)sVar5;
        sVar5 = strlen(local_18);
        local_20 = (vector<int,_std::allocator<int>_> *)((long)pvVar6 + (-1 - sVar5));
        sVar2 = std::vector<int,_std::allocator<int>_>::size(&local_38);
        if ((local_50 + 1 < sVar2) &&
           (pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](&local_38,local_50 + 1),
           *pvVar3 != *(int *)(in_RDI + 0x3c))) {
          local_18[iVar1] = ',';
          local_18[iVar1 + 1] = '\0';
          local_18 = local_18 + (iVar1 + 1);
        }
      }
    }
    std::vector<int,_std::allocator<int>_>::~vector(in_stack_ffffffffffffff70);
  }
  return;
}

Assistant:

virtual void getNonDefaultString(int granularity, char *buffer, size_t size)
    {
        if (granularity != 0) {
            std::vector<int> values;
            fillGranularityDomain(granularity, values);
            for (size_t i = 0; i < values.size(); ++i) {
                if (values[i] == defaultValue) {
                    continue;
                }                                        // do not print default value
                snprintf(buffer, size, "%d", values[i]); // convert value
                const int sl = strlen(buffer);
                size = size - strlen(buffer) - 1; // store new size
                if (i + 1 < values.size() && values[i + 1] != defaultValue) {
                    buffer[sl] = ',';           // set separator
                    buffer[sl + 1] = 0;         // indicate end of buffer
                    buffer = &(buffer[sl + 1]); // move start pointer accordingly (len is one more now)
                }
            }
        } else if (range.end - range.begin <= 16 && range.end - range.begin > 1) {
            for (int i = range.begin; i <= range.end; ++i) {
                if (i == defaultValue) {
                    continue;
                }                                // do not print default value
                snprintf(buffer, size, "%d", i); // convert value
                const int sl = strlen(buffer);
                size = size - strlen(buffer) - 1; // store new size
                if (i != range.end && i + 1 != defaultValue) {
                    buffer[sl] = ',';           // set separator
                    buffer[sl + 1] = 0;         // indicate end of buffer
                    buffer = &(buffer[sl + 1]); // move start pointer accordingly (len is one more now)
                }
            }
        }
    }